

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_Mixer2(opm_t *chip)

{
  uint8_t local_17;
  byte local_16;
  byte local_15;
  uint8_t ex;
  uint8_t top;
  uint8_t bit;
  uint32_t cycles;
  opm_t *chip_local;
  
  if ((chip->cycles + 0x1e & 0x1f) < 0x10) {
    local_15 = (byte)chip->mix_serial[0];
  }
  else {
    local_15 = (byte)chip->mix_serial[1];
  }
  local_15 = local_15 & 1;
  if ((chip->cycles & 0xf) == 1) {
    chip->mix_sign_lock = local_15 ^ 1;
    chip->mix_top_bits_lock = chip->mix_bits >> 0xf & 0x3f;
  }
  chip->mix_bits = chip->mix_bits >> 1;
  chip->mix_bits = (uint)local_15 << 0x14 | chip->mix_bits;
  if ((chip->cycles & 0xf) == 10) {
    local_16 = (byte)chip->mix_top_bits_lock;
    if (chip->mix_sign_lock != '\0') {
      local_16 = local_16 ^ 0x3f;
    }
    if ((local_16 & 0x20) == 0) {
      if ((local_16 & 0x10) == 0) {
        if ((local_16 & 8) == 0) {
          if ((local_16 & 4) == 0) {
            if ((local_16 & 2) == 0) {
              if ((local_16 & 1) == 0) {
                local_17 = '\x01';
              }
              else {
                local_17 = '\x02';
              }
            }
            else {
              local_17 = '\x03';
            }
          }
          else {
            local_17 = '\x04';
          }
        }
        else {
          local_17 = '\x05';
        }
      }
      else {
        local_17 = '\x06';
      }
    }
    else {
      local_17 = '\a';
    }
    chip->mix_sign_lock2 = chip->mix_sign_lock;
    chip->mix_exp_lock = local_17;
  }
  chip->mix_out_bit = chip->mix_out_bit * '\x02';
  switch(chip->cycles + 1 & 0xf) {
  case 0:
    chip->mix_out_bit = chip->mix_out_bit | chip->mix_sign_lock2 ^ 1;
    break;
  case 1:
    chip->mix_out_bit = chip->mix_out_bit | chip->mix_exp_lock & 1;
    break;
  case 2:
    chip->mix_out_bit = chip->mix_out_bit | (byte)((int)(uint)chip->mix_exp_lock >> 1) & 1;
    break;
  case 3:
    chip->mix_out_bit = chip->mix_out_bit | (byte)((int)(uint)chip->mix_exp_lock >> 2) & 1;
    break;
  default:
    if (chip->mix_exp_lock != '\0') {
      chip->mix_out_bit =
           chip->mix_out_bit | (byte)(chip->mix_bits >> (chip->mix_exp_lock - 1 & 0x1f)) & 1;
    }
  }
  return;
}

Assistant:

static void OPM_Mixer2(opm_t *chip)
{
    uint32_t cycles = (chip->cycles + 30) % 32;
    uint8_t bit;
    uint8_t top, ex;
    if (cycles < 16)
    {
        bit = chip->mix_serial[0] & 1;
    }
    else
    {
        bit = chip->mix_serial[1] & 1;
    }
    if (chip->cycles % 16 == 1)
    {
        chip->mix_sign_lock = bit ^ 1;
        chip->mix_top_bits_lock = (chip->mix_bits >> 15) & 63;
    }
    chip->mix_bits >>= 1;
    chip->mix_bits |= bit << 20;
    if (chip->cycles % 16 == 10)
    {
        top = chip->mix_top_bits_lock;
        if (chip->mix_sign_lock)
        {
            top ^= 63;
        }
        if (top & 32)
        {
            ex = 7;
        }
        else if (top & 16)
        {
            ex = 6;
        }
        else if (top & 8)
        {
            ex = 5;
        }
        else if (top & 4)
        {
            ex = 4;
        }
        else if (top & 2)
        {
            ex = 3;
        }
        else if (top & 1)
        {
            ex = 2;
        }
        else
        {
            ex = 1;
        }
        chip->mix_sign_lock2 = chip->mix_sign_lock;
        chip->mix_exp_lock = ex;
    }
    chip->mix_out_bit <<= 1;
    switch ((chip->cycles + 1) % 16)
    {
    case 0:
        chip->mix_out_bit |= chip->mix_sign_lock2 ^ 1;
        break;
    case 1:
        chip->mix_out_bit |= (chip->mix_exp_lock >> 0) & 1;
        break;
    case 2:
        chip->mix_out_bit |= (chip->mix_exp_lock >> 1) & 1;
        break;
    case 3:
        chip->mix_out_bit |= (chip->mix_exp_lock >> 2) & 1;
        break;
    default:
        if (chip->mix_exp_lock)
        {
            chip->mix_out_bit |= (chip->mix_bits >> (chip->mix_exp_lock - 1)) & 1;
        }
        break;
    }
}